

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall despot::TabularCPT::ComputeSparseChildDistribution(TabularCPT *this)

{
  reference this_00;
  double extraout_XMM0_Qa;
  double local_38;
  pair<int,_double> local_30;
  uint local_20;
  uint local_1c;
  int c;
  int p;
  int child_size;
  int parent_size;
  TabularCPT *this_local;
  
  _child_size = this;
  p = (*(this->super_CPT).super_Function._vptr_Function[7])();
  c = (*(this->super_CPT).super_Function._vptr_Function[9])();
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::resize(&this->sparse_values_,(long)p);
  for (local_1c = 0; (int)local_1c < p; local_1c = local_1c + 1) {
    for (local_20 = 0; (int)local_20 < c; local_20 = local_20 + 1) {
      (*(this->super_CPT).super_Function._vptr_Function[4])(this,(ulong)local_1c,(ulong)local_20);
      if (0.0 < extraout_XMM0_Qa) {
        this_00 = std::
                  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ::operator[](&this->sparse_values_,(long)(int)local_1c);
        (*(this->super_CPT).super_Function._vptr_Function[4])(this,(ulong)local_1c,(ulong)local_20);
        std::pair<int,_double>::pair<int_&,_double,_true>(&local_30,(int *)&local_20,&local_38);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  (this_00,&local_30);
      }
    }
  }
  return;
}

Assistant:

void TabularCPT::ComputeSparseChildDistribution() {
	int parent_size = ParentSize(), child_size = ChildSize();
	sparse_values_.resize(parent_size);
	for (int p = 0; p < parent_size; p++) {
		for (int c = 0; c < child_size; c++) {
			if (GetValue(p, c) > 0)
				sparse_values_[p].push_back(
					pair<int, double>(c, GetValue(p, c)));
		}
	}
}